

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O3

void png_free_buffer_list(png_structrp png_ptr,png_compression_bufferp *listp)

{
  png_compression_buffer *ppVar1;
  png_compression_bufferp ptr;
  
  ptr = *listp;
  if (ptr != (png_compression_bufferp)0x0) {
    *listp = (png_compression_bufferp)0x0;
    do {
      ppVar1 = ptr->next;
      png_free(png_ptr,ptr);
      ptr = ppVar1;
    } while (ppVar1 != (png_compression_buffer *)0x0);
  }
  return;
}

Assistant:

void /* PRIVATE */
png_free_buffer_list(png_structrp png_ptr, png_compression_bufferp *listp)
{
   png_compression_bufferp list = *listp;

   if (list != NULL)
   {
      *listp = NULL;

      do
      {
         png_compression_bufferp next = list->next;

         png_free(png_ptr, list);
         list = next;
      }
      while (list != NULL);
   }
}